

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QColorDialogPrivate::initHelper(QColorDialogPrivate *this,QPlatformDialogHelper *h)

{
  ConnectionType type;
  long in_FS_OFFSET;
  Object local_50 [8];
  code *local_48;
  undefined8 local_40;
  Object local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = QColorDialog::currentColorChanged;
  local_40 = 0;
  type = (ConnectionType)*(undefined8 *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8
  ;
  QObject::
  connect<void(QPlatformColorDialogHelper::*)(QColor_const&),void(QColorDialog::*)(QColor_const&)>
            (local_38,(offset_in_QPlatformColorDialogHelper_to_subr)h,
             (ContextType *)QPlatformColorDialogHelper::currentColorChanged,
             (offset_in_QColorDialog_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  local_48 = QColorDialog::colorSelected;
  local_40 = 0;
  QObject::
  connect<void(QPlatformColorDialogHelper::*)(QColor_const&),void(QColorDialog::*)(QColor_const&)>
            (local_50,(offset_in_QPlatformColorDialogHelper_to_subr)h,
             (ContextType *)QPlatformColorDialogHelper::colorSelected,
             (offset_in_QColorDialog_to_subr *)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QPlatformColorDialogHelper::setOptions((QSharedPointer *)h);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::initHelper(QPlatformDialogHelper *h)
{
    QColorDialog *d = q_func();
    auto *colorDialogHelper = static_cast<QPlatformColorDialogHelper*>(h);
    QObject::connect(colorDialogHelper, &QPlatformColorDialogHelper::currentColorChanged,
                     d, &QColorDialog::currentColorChanged);
    QObject::connect(colorDialogHelper, &QPlatformColorDialogHelper::colorSelected,
                     d, &QColorDialog::colorSelected);
    colorDialogHelper->setOptions(options);
}